

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<float>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  long *plVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  void *__src;
  size_t sVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  uint uVar16;
  float fVar17;
  string result_str;
  string reference_str;
  float reference [8];
  float result [8];
  stringstream ss;
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  long *local_260;
  long local_250 [2];
  AttributeFormatTest *local_240;
  float local_238 [8];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8 [4];
  float fStack_1e8;
  float local_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float local_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined8 local_1c4;
  float local_1bc;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar11 + 0x1680))(this->m_po);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  local_240 = this;
  (**(code **)(lVar11 + 0xd8))(this->m_vao);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar11 + 0x30))(0);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar11 + 0x538))(0,0,2);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar11 + 0x638))();
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  __src = (void *)(**(code **)(lVar11 + 0xcf8))(0x8c8e,35000);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uVar3 = size * 2;
  uVar13 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    memcpy(&local_218,__src,uVar13 * 4);
  }
  (**(code **)(lVar11 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar6,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar16 = 0x3fb00000;
  }
  else {
    uVar16 = 0x3ff00000;
  }
  local_1f8[0] = 0.0;
  dVar1 = (double)((ulong)uVar16 << 0x20);
  dVar2 = (double)((ulong)uVar16 << 0x20);
  local_1f8[1] = (float)(double)((ulong)uVar16 << 0x20);
  local_1f8[2] = (float)((double)((ulong)uVar16 << 0x20) + (double)((ulong)uVar16 << 0x20));
  local_1f8[3] = (float)(dVar1 * 3.0);
  fStack_1e8 = (float)(dVar2 * 4.0);
  local_1e4 = (float)(dVar1 * 5.0);
  fStack_1e0 = (float)(dVar2 * 6.0);
  fStack_1dc = (float)(dVar1 * 7.0);
  fStack_1d8 = (float)(dVar2 * 8.0);
  local_1d4 = (float)(dVar1 * 9.0);
  fStack_1d0 = (float)(dVar2 * 10.0);
  fStack_1cc = (float)(dVar1 * 11.0);
  fStack_1c8 = (float)(dVar2 * 12.0);
  local_1c4 = CONCAT44((float)(dVar2 * 14.0),(float)(dVar1 * 13.0));
  local_1bc = (float)((double)((ulong)uVar16 << 0x20) * 15.0);
  local_238[4] = 0.0;
  local_238[5] = 0.0;
  local_238[6] = 0.0;
  local_238[7] = 0.0;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  local_238[3] = 0.0;
  lVar11 = 0;
  bVar14 = true;
  do {
    bVar8 = bVar14;
    if (0 < size) {
      iVar5 = size * (int)lVar11 * 2;
      lVar9 = lVar11 * ((ulong)(uint)size << 0x20);
      iVar10 = ((int)lVar11 * 2 + 1) * size;
      uVar12 = (ulong)(uint)size;
      do {
        *(float *)((long)local_238 + (lVar9 >> 0x1e)) = local_1f8[iVar5] + local_1f8[iVar10];
        lVar9 = lVar9 + 0x100000000;
        iVar10 = iVar10 + 1;
        iVar5 = iVar5 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    lVar11 = 1;
    bVar14 = false;
  } while (bVar8);
  bVar14 = true;
  if (0 < (int)uVar3) {
    fVar15 = local_238[0] - (float)local_218;
    fVar17 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar17 = fVar15;
    }
    if (0.03125 <= fVar17) {
      bVar14 = false;
    }
    else {
      uVar12 = 0;
      do {
        if (uVar13 - 1 == uVar12) {
          return true;
        }
        fVar15 = local_238[uVar12 + 1] - *(float *)((long)&local_218 + uVar12 * 4 + 4);
        fVar17 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar17 = fVar15;
        }
        uVar12 = uVar12 + 1;
      } while (fVar17 < 0.03125);
      bVar14 = uVar13 <= uVar12;
    }
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"[ ","");
    uVar12 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)local_238[uVar12]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_280,(ulong)local_2a0[0]);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0],local_290[0] + 1);
      }
      std::__cxx11::string::append((char *)local_280);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"[ ","");
    uVar12 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)*(float *)((long)&local_218 + uVar12 * 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_260);
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      std::__cxx11::string::append((char *)local_2a0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    local_1b8 = (undefined1  [8])((local_240->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Result vector is equal to ",0x1a);
    plVar4 = local_2a0[0];
    iVar5 = (int)(ostringstream *)&local_1b0;
    if (local_2a0[0] == (long *)0x0) {
      std::ios::clear(iVar5 + (int)local_1b0[-3]);
    }
    else {
      sVar7 = strlen((char *)local_2a0[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar4,sVar7)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", but ",6);
    plVar4 = local_280[0];
    if (local_280[0] == (long *)0x0) {
      std::ios::clear(iVar5 + (int)local_1b0[-3]);
    }
    else {
      sVar7 = strlen((char *)local_280[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar4,sVar7)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    if (local_280[0] != local_270) {
      operator_delete(local_280[0],local_270[0] + 1);
    }
  }
  return bVar14;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}